

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O2

uint16_t __thiscall
anon_unknown.dwarf_4d369::CtorEvalExternalInterface::load16u
          (CtorEvalExternalInterface *this,Address addr,Name memoryName)

{
  iterator iVar1;
  pointer pcVar2;
  key_type local_28;
  
  local_28.super_IString.str._M_str = memoryName.super_IString.str._M_str;
  local_28.super_IString.str._M_len = memoryName.super_IString.str._M_len;
  iVar1 = std::
          _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->memories)._M_h,&local_28);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    pcVar2 = *(pointer *)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_true>
                     ._M_cur + 0x18);
    if ((ulong)(*(long *)((long)iVar1.
                                super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_true>
                                ._M_cur + 0x20) - (long)pcVar2) < addr.addr + 2) {
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)
                 ((long)iVar1.
                        super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_true>
                        ._M_cur + 0x18),addr.addr + 2);
      pcVar2 = (((vector<char,_std::allocator<char>_> *)
                ((long)iVar1.
                       super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_true>
                       ._M_cur + 0x18))->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    return *(uint16_t *)(pcVar2 + addr.addr);
  }
  __assert_fail("it != memories.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp"
                ,0x1b8,
                "T *(anonymous namespace)::CtorEvalExternalInterface::getMemory(Address, Name) [T = unsigned short]"
               );
}

Assistant:

uint16_t load16u(Address addr, Name memoryName) override {
    return doLoad<uint16_t>(addr, memoryName);
  }